

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

nfa_state_t * __thiscall re2c::RuleOp::compile(RuleOp *this,nfa_t *nfa,nfa_state_t *param_2)

{
  uint uVar1;
  uint uVar2;
  nfa_state_t *pnVar3;
  nfa_state_t *pnVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  nfa_state_t *pnVar6;
  
  pnVar3 = nfa->states;
  uVar1 = nfa->size;
  nfa->size = uVar1 + 1;
  pnVar3[uVar1].type = FIN;
  pnVar3[uVar1].value.alt.out1 = (nfa_state_t *)this;
  pnVar3[uVar1].mark = false;
  iVar5 = (*this->ctx->_vptr_RegExp[3])();
  pnVar6 = pnVar3 + uVar1;
  if (iVar5 != 0) {
    pnVar4 = nfa->states;
    uVar2 = nfa->size;
    nfa->size = uVar2 + 1;
    pnVar6 = pnVar4 + uVar2;
    iVar5 = (*this->ctx->_vptr_RegExp[5])(this->ctx,nfa,pnVar3 + uVar1);
    pnVar4[uVar2].type = CTX;
    pnVar4[uVar2].value.ctx.out = (nfa_state_t *)CONCAT44(extraout_var,iVar5);
    pnVar4[uVar2].mark = false;
  }
  iVar5 = (*this->exp->_vptr_RegExp[5])(this->exp,nfa,pnVar6);
  return (nfa_state_t *)CONCAT44(extraout_var_00,iVar5);
}

Assistant:

nfa_state_t *RuleOp::compile(nfa_t &nfa, nfa_state_t *)
{
	nfa_state_t *s3 = &nfa.states[nfa.size++];
	s3->fin(this);
	if (ctx->calc_size() > 0)
	{
		nfa_state_t *s2 = &nfa.states[nfa.size++];
		s2->ctx(ctx->compile(nfa, s3));
		s3 = s2;
	}
	nfa_state_t *s1 = exp->compile(nfa, s3);
	return s1;
}